

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O2

void __thiscall
Kernel::DisagreementSetIterator::reset
          (DisagreementSetIterator *this,TermList t1,TermList t2,bool disjunctVariables)

{
  bool bVar1;
  
  (this->_stack)._cursor = (this->_stack)._stack;
  this->_disjunctVariables = disjunctVariables;
  bVar1 = TermList::sameTop(t1,t2);
  if ((!bVar1) || (disjunctVariables && (t1._content & 1) != 0)) {
    (this->_arg1)._content = t1._content;
    (this->_arg2)._content = t2._content;
  }
  else {
    (this->_arg1)._content = 2;
    if (((t1._content & 3) == 0) && ((*(uint *)(t1._content + 0xc) & 0xfffffff) != 0)) {
      Lib::Stack<Kernel::TermList_*>::push
                (&this->_stack,
                 (TermList *)
                 (t1._content + ((ulong)*(uint *)(t1._content + 0xc) & 0xfffffff) * 8 + 0x28));
      Lib::Stack<Kernel::TermList_*>::push
                (&this->_stack,
                 (TermList *)
                 (t2._content + (ulong)(*(uint *)(t2._content + 0xc) & 0xfffffff) * 8 + 0x28));
      return;
    }
  }
  return;
}

Assistant:

void reset(TermList t1, TermList t2, bool disjunctVariables=true)
  {
    ASS(!t1.isEmpty());
    ASS(!t2.isEmpty());

    _stack.reset();
    _disjunctVariables=disjunctVariables;
    if(!TermList::sameTop(t1,t2) || (t1.isVar() && disjunctVariables)) {
      _arg1=t1;
      _arg2=t2;
      return;
    }
    _arg1 = TermList::empty();
    if(t1.isTerm() && t1.term()->arity()>0) {
      _stack.push(t1.term()->args());
      _stack.push(t2.term()->args());
    }
  }